

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

int google::protobuf::UnescapeCEscapeSequences
              (char *source,char *dest,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *errors)

{
  byte *pbVar1;
  byte bVar2;
  LogMessage *pLVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte bVar6;
  uint uVar7;
  byte bVar8;
  bool bVar9;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (errors != (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x150);
    pLVar3 = internal::LogMessage::operator<<(&local_58,"CHECK failed: errors == NULL: ");
    pLVar3 = internal::LogMessage::operator<<(pLVar3,"Error reporting not implemented.");
    internal::LogFinisher::operator=(&local_59,pLVar3);
    internal::LogMessage::~LogMessage(&local_58);
  }
  pbVar4 = (byte *)dest;
  pbVar5 = (byte *)dest;
  if (source == dest) {
    do {
      pbVar4 = pbVar5;
      if ((*source == 0) || (*source == 0x5c)) break;
      pbVar1 = (byte *)source + 1;
      bVar9 = pbVar5 == (byte *)source;
      pbVar4 = pbVar5 + 1;
      pbVar5 = pbVar5 + 1;
      source = (char *)pbVar1;
    } while (bVar9);
  }
  do {
    bVar6 = *source;
    if (bVar6 != 0x5c) {
      pbVar5 = (byte *)source;
      if (bVar6 != 0) goto LAB_005f810c;
LAB_005f8120:
      *pbVar4 = 0;
      return (int)pbVar4 - (int)dest;
    }
    pbVar5 = (byte *)source + 1;
    bVar6 = ((byte *)source)[1];
    uVar7 = (uint)bVar6;
    if (bVar6 < 0x3f) {
      if (0x2f < bVar6) {
        if (uVar7 - 0x30 < 8) {
          bVar2 = bVar6 - 0x30;
          pbVar1 = pbVar5;
          if ((((byte *)source)[2] & 0xf8) == 0x30) {
            bVar2 = ((bVar6 - 0x30) * '\b' + ((byte *)source)[2]) - 0x30;
            pbVar1 = (byte *)source + 2;
          }
          pbVar5 = pbVar1 + 1;
          bVar6 = (bVar2 * '\b' + pbVar1[1]) - 0x30;
          if ((pbVar1[1] & 0xf8) != 0x30) {
            pbVar5 = pbVar1;
            bVar6 = bVar2;
          }
          goto LAB_005f810c;
        }
        goto switchD_005f7fb9_caseD_6f;
      }
      if ((bVar6 == 0x22) || (bVar6 == 0x27)) goto LAB_005f810c;
      if (bVar6 == 0) goto LAB_005f8120;
    }
    else {
      if (bVar6 < 0x62) {
        if (bVar6 < 0x5c) {
          if (uVar7 == 0x3f) goto LAB_005f810c;
          if (bVar6 == 0x58) goto switchD_005f7fb9_caseD_78;
        }
        else if ((bVar6 == 0x5c) || (bVar6 = 7, uVar7 == 0x61)) goto LAB_005f810c;
        goto switchD_005f7fb9_caseD_6f;
      }
      switch(bVar6) {
      case 0x6e:
        bVar6 = 10;
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
      case 0x75:
      case 0x77:
        goto switchD_005f7fb9_caseD_6f;
      case 0x72:
        bVar6 = 0xd;
        break;
      case 0x74:
        bVar6 = 9;
        break;
      case 0x76:
        bVar6 = 0xb;
        break;
      case 0x78:
switchD_005f7fb9_caseD_78:
        if (((byte)(((byte *)source)[2] - 0x30) < 10) ||
           ((uVar7 = ((byte *)source)[2] - 0x41, uVar7 < 0x26 &&
            ((0x3f0000003fU >> ((ulong)uVar7 & 0x3f) & 1) != 0)))) {
          bVar6 = 0;
          while ((bVar2 = pbVar5[1], (byte)(bVar2 - 0x30) < 10 ||
                 ((bVar2 - 0x41 < 0x26 &&
                  ((0x3f0000003fU >> ((ulong)(bVar2 - 0x41) & 0x3f) & 1) != 0))))) {
            pbVar5 = pbVar5 + 1;
            bVar8 = bVar2 + 9;
            if (bVar2 < 0x3a) {
              bVar8 = bVar2;
            }
            bVar6 = bVar6 << 4 | bVar8 & 0xf;
          }
          break;
        }
        goto switchD_005f7fb9_caseD_6f;
      default:
        if (bVar6 == 0x66) {
          bVar6 = 0xc;
        }
        else {
          if (bVar6 != 0x62) goto switchD_005f7fb9_caseD_6f;
          bVar6 = 8;
        }
      }
LAB_005f810c:
      *pbVar4 = bVar6;
      pbVar4 = pbVar4 + 1;
    }
switchD_005f7fb9_caseD_6f:
    source = (char *)(pbVar5 + 1);
  } while( true );
}

Assistant:

int UnescapeCEscapeSequences(const char* source, char* dest,
                             vector<string> *errors) {
  GOOGLE_DCHECK(errors == NULL) << "Error reporting not implemented.";

  char* d = dest;
  const char* p = source;

  // Small optimization for case where source = dest and there's no escaping
  while ( p == d && *p != '\0' && *p != '\\' )
    p++, d++;

  while (*p != '\0') {
    if (*p != '\\') {
      *d++ = *p++;
    } else {
      switch ( *++p ) {                    // skip past the '\\'
        case '\0':
          LOG_STRING(ERROR, errors) << "String cannot end with \\";
          *d = '\0';
          return d - dest;   // we're done with p
        case 'a':  *d++ = '\a';  break;
        case 'b':  *d++ = '\b';  break;
        case 'f':  *d++ = '\f';  break;
        case 'n':  *d++ = '\n';  break;
        case 'r':  *d++ = '\r';  break;
        case 't':  *d++ = '\t';  break;
        case 'v':  *d++ = '\v';  break;
        case '\\': *d++ = '\\';  break;
        case '?':  *d++ = '\?';  break;    // \?  Who knew?
        case '\'': *d++ = '\'';  break;
        case '"':  *d++ = '\"';  break;
        case '0': case '1': case '2': case '3':  // octal digit: 1 to 3 digits
        case '4': case '5': case '6': case '7': {
          char ch = *p - '0';
          if ( IS_OCTAL_DIGIT(p[1]) )
            ch = ch * 8 + *++p - '0';
          if ( IS_OCTAL_DIGIT(p[1]) )      // safe (and easy) to do this twice
            ch = ch * 8 + *++p - '0';      // now points at last digit
          *d++ = ch;
          break;
        }
        case 'x': case 'X': {
          if (!isxdigit(p[1])) {
            if (p[1] == '\0') {
              LOG_STRING(ERROR, errors) << "String cannot end with \\x";
            } else {
              LOG_STRING(ERROR, errors) <<
                "\\x cannot be followed by non-hex digit: \\" << *p << p[1];
            }
            break;
          }
          unsigned int ch = 0;
          const char *hex_start = p;
          while (isxdigit(p[1]))  // arbitrarily many hex digits
            ch = (ch << 4) + hex_digit_to_int(*++p);
          if (ch > 0xFF)
            LOG_STRING(ERROR, errors) << "Value of " <<
              "\\" << string(hex_start, p+1-hex_start) << " exceeds 8 bits";
          *d++ = ch;
          break;
        }
#if 0  // TODO(kenton):  Support \u and \U?  Requires runetochar().
        case 'u': {
          // \uhhhh => convert 4 hex digits to UTF-8
          char32 rune = 0;
          const char *hex_start = p;
          for (int i = 0; i < 4; ++i) {
            if (isxdigit(p[1])) {  // Look one char ahead.
              rune = (rune << 4) + hex_digit_to_int(*++p);  // Advance p.
            } else {
              LOG_STRING(ERROR, errors)
                << "\\u must be followed by 4 hex digits: \\"
                <<  string(hex_start, p+1-hex_start);
              break;
            }
          }
          d += runetochar(d, &rune);
          break;
        }
        case 'U': {
          // \Uhhhhhhhh => convert 8 hex digits to UTF-8
          char32 rune = 0;
          const char *hex_start = p;
          for (int i = 0; i < 8; ++i) {
            if (isxdigit(p[1])) {  // Look one char ahead.
              // Don't change rune until we're sure this
              // is within the Unicode limit, but do advance p.
              char32 newrune = (rune << 4) + hex_digit_to_int(*++p);
              if (newrune > 0x10FFFF) {
                LOG_STRING(ERROR, errors)
                  << "Value of \\"
                  << string(hex_start, p + 1 - hex_start)
                  << " exceeds Unicode limit (0x10FFFF)";
                break;
              } else {
                rune = newrune;
              }
            } else {
              LOG_STRING(ERROR, errors)
                << "\\U must be followed by 8 hex digits: \\"
                <<  string(hex_start, p+1-hex_start);
              break;
            }
          }
          d += runetochar(d, &rune);
          break;
        }
#endif
        default:
          LOG_STRING(ERROR, errors) << "Unknown escape sequence: \\" << *p;
      }
      p++;                                 // read past letter we escaped
    }
  }
  *d = '\0';
  return d - dest;
}